

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimistic_lock.hpp
# Opt level: O3

void __thiscall unodb::optimistic_lock::version_type::dump(version_type *this,ostream *os)

{
  long lVar1;
  ostream *poVar2;
  ulong uVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"version = 0x",0xc);
  lVar1 = *(long *)os;
  *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar2 = os + *(long *)(lVar1 + -0x18);
  if (os[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar2);
    poVar2[0xe1] = (ostream)0x1;
    lVar1 = *(long *)os;
  }
  poVar2[0xe0] = (ostream)0x30;
  *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 0x10) = 8;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  uVar3 = this->version;
  if ((uVar3 & 2) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (write locked)",0xf);
    uVar3 = this->version;
  }
  if (uVar3 == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (obsoleted)",0xc);
    return;
  }
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump(std::ostream &os) const {
      os << "version = 0x" << std::hex << std::setfill('0') << std::setw(8)
         << version << std::dec;
      if (is_write_locked()) os << " (write locked)";
      if (is_obsolete()) os << " (obsoleted)";
    }